

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_file.hpp
# Opt level: O2

bool __thiscall
coro_io::basic_random_coro_file<(coro_io::execution_type)2>::open_fd
          (basic_random_coro_file<(coro_io::execution_type)2> *this,string_view filepath,
          int open_flags)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  __shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  bVar3 = true;
  if ((this->prw_random_file_).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    bVar3 = false;
    iVar1 = ::open(filepath._M_str,open_flags);
    if (-1 < iVar1) {
      piVar2 = (int *)operator_new(4);
      *piVar2 = iVar1;
      std::__shared_ptr<int,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<int,coro_io::basic_random_coro_file<(coro_io::execution_type)2>::open_fd(std::basic_string_view<char,std::char_traits<char>>,int)::_lambda(int*)_1_,void>
                ((__shared_ptr<int,(__gnu_cxx::_Lock_policy)2> *)&_Stack_28,piVar2);
      std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->prw_random_file_).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>,
                 &_Stack_28);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool open_fd(std::string_view filepath, int open_flags) {
    if (prw_random_file_) {
      return true;
    }

#if defined(ASIO_WINDOWS)
    int fd = _open(filepath.data(), adjust_flags(open_flags));
#else
    int fd = ::open(filepath.data(), open_flags);
#endif
    if (fd < 0) {
      return false;
    }

    prw_random_file_ = std::shared_ptr<int>(new int(fd), [](int *ptr) {
#if defined(ASIO_WINDOWS)
      _close(*ptr);
#else
      ::close(*ptr);
#endif
      delete ptr;
    });
    return true;
  }